

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_read_pcm_frames_be(ma_dr_wav *pWav,ma_uint64 framesToRead,void *pBufferOut)

{
  ma_uint8 mVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ma_uint32 mVar5;
  ma_uint8 *pmVar6;
  ulong uVar7;
  ma_dr_wav *in_RDX;
  ma_dr_wav *in_RDI;
  ma_uint32 bytesPerFrame;
  ma_uint64 framesRead;
  ma_uint64 iSample;
  ma_uint64 iSample_2;
  ma_uint8 *pSample;
  ma_uint64 iSample_1;
  ma_uint64 iSample_3;
  ma_uint8 t;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  ma_uint64 in_stack_ffffffffffffff28;
  ma_uint64 local_b8;
  ulong local_98;
  ulong local_80;
  ulong local_60;
  ulong local_48;
  
  local_b8 = ma_dr_wav_read_pcm_frames_le
                       (in_RDX,in_stack_ffffffffffffff28,
                        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (in_RDX != (ma_dr_wav *)0x0) {
    mVar5 = ma_dr_wav_get_bytes_per_pcm_frame(in_RDI);
    if (mVar5 == 0) {
      local_b8 = 0;
    }
    else {
      uVar7 = local_b8 * in_RDI->channels;
      switch(mVar5 / in_RDI->channels) {
      case 1:
        break;
      case 2:
        for (local_98 = 0; local_98 < uVar7; local_98 = local_98 + 1) {
          uVar2 = *(ushort *)((in_RDX->fmt).subFormat + local_98 * 2 + -0x5c);
          *(ushort *)((in_RDX->fmt).subFormat + local_98 * 2 + -0x5c) = uVar2 << 8 | uVar2 >> 8;
        }
        break;
      case 3:
        for (local_60 = 0; local_60 < uVar7; local_60 = local_60 + 1) {
          pmVar6 = (in_RDX->fmt).subFormat + local_60 * 3 + -0x5c;
          mVar1 = *pmVar6;
          *pmVar6 = pmVar6[2];
          pmVar6[2] = mVar1;
        }
        break;
      case 4:
        for (local_80 = 0; local_80 < uVar7; local_80 = local_80 + 1) {
          uVar3 = *(uint *)((in_RDX->fmt).subFormat + local_80 * 4 + -0x5c);
          *(uint *)((in_RDX->fmt).subFormat + local_80 * 4 + -0x5c) =
               uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        }
        break;
      default:
        break;
      case 8:
        for (local_48 = 0; local_48 < uVar7; local_48 = local_48 + 1) {
          uVar4 = *(ulong *)((in_RDX->fmt).subFormat + local_48 * 8 + -0x5c);
          *(ulong *)((in_RDX->fmt).subFormat + local_48 * 8 + -0x5c) =
               uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
               | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 |
               (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        }
      }
    }
  }
  return local_b8;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_be(ma_dr_wav* pWav, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_le(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL) {
        ma_uint32 bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
        if (bytesPerFrame == 0) {
            return 0;
        }
        ma_dr_wav__bswap_samples(pBufferOut, framesRead*pWav->channels, bytesPerFrame/pWav->channels);
    }
    return framesRead;
}